

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O1

size_t __thiscall
google::protobuf::FieldOptions_EditionDefault::ByteSizeLong(FieldOptions_EditionDefault *this)

{
  int iVar1;
  long lVar2;
  anon_union_24_1_493b367e_for_FieldOptions_EditionDefault_3 aVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  
  aVar3 = this->field_0;
  if (((undefined1  [24])aVar3 & (undefined1  [24])0x3) == (undefined1  [24])0x0) {
    sVar6 = 0;
  }
  else {
    if (((undefined1  [24])aVar3 & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
      sVar6 = 0;
    }
    else {
      lVar2 = *(long *)(((ulong)(this->field_0)._impl_.value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                       + 8);
      uVar5 = (uint)lVar2 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = lVar2 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [24])aVar3 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      uVar4 = (long)(this->field_0)._impl_.edition_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

PROTOBUF_ALWAYS_INLINE void PrefetchLine(const void* ptr, size_t line) {
  static_assert(kOpts.from.unit == PrefetchOpts::kBytes);
  const ptrdiff_t offset = kOpts.from.num + (line * ABSL_CACHELINE_SIZE);
  // Pointer + offset overflows don't matter for prefetching, because the
  // prefetch instruction is just a no-op for invalid addresses (although
  // potentially incurring the cost of a TLB page-walk if there's no valid
  // mapping for the page - but that should be rare in practice). Still, to
  // formally avoid UB, we perform the arithmetic in uintptr_t space.
  const void* prefetch_ptr =
      reinterpret_cast<const void*>(reinterpret_cast<uintptr_t>(ptr) + offset);
  __builtin_prefetch(prefetch_ptr, kOpts.mem_op, kOpts.locality);
}